

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_div_2d(mp_int *a,int b,mp_int *c,mp_int *d)

{
  ulong uVar1;
  mp_digit *pmVar2;
  bool bVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  sbyte sVar7;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  mp_int t;
  mp_int t_1;
  mp_int local_68;
  mp_int local_48;
  
  if (b < 1) {
    iVar6 = mp_copy(a,c);
    if (d != (mp_int *)0x0) {
      d->sign = 0;
      d->used = 0;
      if (0 < (long)d->alloc) {
        memset(d->dp,0,(long)d->alloc << 3);
      }
    }
  }
  else {
    local_68.dp = (mp_digit *)malloc(0x100);
    if (local_68.dp == (mp_digit *)0x0) {
      iVar6 = -2;
    }
    else {
      memset(local_68.dp,0,0x100);
      local_68.used = 0;
      local_68.alloc = 0x20;
      local_68._8_8_ = (ulong)(uint)local_68._12_4_ << 0x20;
      if (((d == (mp_int *)0x0) || (iVar6 = mp_mod_2d(a,b,&local_68), iVar6 == 0)) &&
         (iVar6 = mp_copy(a,c), iVar6 == 0)) {
        if (0x3b < b) {
          mp_rshd(c,(uint)b / 0x3c);
        }
        if ((uint)b % 0x3c != 0) {
          sVar7 = (sbyte)((uint)b % 0x3c);
          uVar9 = (ulong)c->used;
          if (0 < (long)uVar9) {
            puVar10 = c->dp + uVar9;
            uVar11 = 0;
            do {
              puVar10 = puVar10 + -1;
              uVar1 = *puVar10;
              *puVar10 = uVar11 << (0x3cU - sVar7 & 0x3f) | uVar1 >> sVar7;
              iVar6 = (int)uVar9;
              uVar8 = iVar6 - 1;
              uVar9 = (ulong)uVar8;
              uVar11 = uVar1 & ~(-1L << sVar7);
            } while (uVar8 != 0 && 0 < iVar6);
          }
        }
        uVar8 = c->used;
        if (0 < (int)uVar8) {
          do {
            if (c->dp[(ulong)uVar8 - 1] != 0) goto LAB_00104114;
            c->used = uVar8 - 1;
            bVar3 = 1 < (int)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar3);
          uVar8 = 0;
        }
LAB_00104114:
        if (uVar8 == 0) {
          c->sign = 0;
        }
        if (d != (mp_int *)0x0) {
          local_48.dp = local_68.dp;
          local_48.used = local_68.used;
          local_48.alloc = local_68.alloc;
          local_48.sign = local_68.sign;
          local_48._12_4_ = local_68._12_4_;
          pmVar2 = d->dp;
          uVar4._0_4_ = d->used;
          uVar4._4_4_ = d->alloc;
          lVar5 = *(long *)&d->sign;
          d->used = local_68.used;
          d->alloc = local_68.alloc;
          d->sign = local_68.sign;
          *(undefined4 *)&d->field_0xc = local_68._12_4_;
          d->dp = local_68.dp;
          local_68._0_8_ = uVar4;
          local_68._8_8_ = lVar5;
          local_68.dp = pmVar2;
        }
        pmVar2 = local_68.dp;
        if (local_68.dp == (mp_digit *)0x0) {
          iVar6 = 0;
        }
        else {
          if (0 < (long)local_68.used) {
            memset(local_68.dp,0,(long)local_68.used << 3);
          }
          free(pmVar2);
          iVar6 = 0;
        }
      }
      else {
        pmVar2 = local_68.dp;
        if (local_68.dp != (mp_digit *)0x0) {
          if (0 < (long)local_68.used) {
            memset(local_68.dp,0,(long)local_68.used << 3);
          }
          free(pmVar2);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int mp_div_2d (mp_int * a, int b, mp_int * c, mp_int * d)
{
  mp_digit D, r, rr;
  int     x, res;
  mp_int  t;


  /* if the shift count is <= 0 then we do no work */
  if (b <= 0) {
    res = mp_copy (a, c);
    if (d != NULL) {
      mp_zero (d);
    }
    return res;
  }

  if ((res = mp_init (&t)) != MP_OKAY) {
    return res;
  }

  /* get the remainder */
  if (d != NULL) {
    if ((res = mp_mod_2d (a, b, &t)) != MP_OKAY) {
      mp_clear (&t);
      return res;
    }
  }

  /* copy */
  if ((res = mp_copy (a, c)) != MP_OKAY) {
    mp_clear (&t);
    return res;
  }

  /* shift by as many digits in the bit count */
  if (b >= (int)DIGIT_BIT) {
    mp_rshd (c, b / DIGIT_BIT);
  }

  /* shift any bit count < DIGIT_BIT */
  D = (mp_digit) (b % DIGIT_BIT);
  if (D != 0) {
    register mp_digit *tmpc, mask, shift;

    /* mask */
    mask = (((mp_digit)1) << D) - 1;

    /* shift for lsb */
    shift = DIGIT_BIT - D;

    /* alias */
    tmpc = c->dp + (c->used - 1);

    /* carry */
    r = 0;
    for (x = c->used - 1; x >= 0; x--) {
      /* get the lower  bits of this word in a temp */
      rr = *tmpc & mask;

      /* shift the current word and mix in the carry bits from the previous word */
      *tmpc = (*tmpc >> D) | (r << shift);
      --tmpc;

      /* set the carry to the carry bits of the current word found above */
      r = rr;
    }
  }
  mp_clamp (c);
  if (d != NULL) {
    mp_exch (&t, d);
  }
  mp_clear (&t);
  return MP_OKAY;
}